

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O2

void Ndr_ObjReadConstant(Vec_Int_t *vFanins,char *pStr)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar5 = 0;
  uVar7 = 0;
  if (pStr != (char *)0x0) {
    sVar2 = strlen(pStr);
    uVar7 = (uint)sVar2;
  }
  uVar6 = 0;
  if (0 < (int)uVar7) {
    uVar6 = (ulong)uVar7;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    if (pStr[uVar5] == 'b') goto LAB_00306323;
  }
  uVar5 = uVar6;
  if (pStr != (char *)0x0) {
LAB_00306323:
    if (pStr[uVar5] == 'b') {
      uVar4 = ~(uint)uVar5 + uVar7;
      Vec_IntFill(vFanins,(((int)uVar4 >> 5) + 1) - (uint)((uVar4 & 0x1f) == 0),0);
      iVar3 = (uVar7 - (uint)uVar5) + -2;
      for (; (int)uVar5 + 1 < (int)uVar7; uVar5 = uVar5 + 1) {
        cVar1 = pStr[uVar5 + 1];
        if (cVar1 == '1') {
          vFanins->pArray[iVar3 >> 5] = vFanins->pArray[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
        }
        else if (cVar1 != '0') {
          printf("Wrongn symbol (%c) in binary Verilog constant \"%s\".\n",(ulong)(uint)(int)cVar1,
                 pStr);
        }
        iVar3 = iVar3 + -1;
      }
      return;
    }
  }
  puts(
      "Constants should be represented in binary Verilog notation <nbits>\'b<bits> as char strings (for example, \"4\'b1010\")."
      );
  return;
}

Assistant:

void Ndr_ObjReadConstant( Vec_Int_t * vFanins, char * pStr )
{
    int i, k, Len = pStr ? strlen(pStr) : 0;
    for ( k = 0; k < Len; k++ )
        if ( pStr[k] == 'b' )
            break;
    if ( pStr == NULL || pStr[k] != 'b' )
    {
        printf( "Constants should be represented in binary Verilog notation <nbits>\'b<bits> as char strings (for example, \"4'b1010\").\n" );
        return;
    }
    Vec_IntFill( vFanins, Abc_BitWordNum(Len-k-1), 0 );
    for ( i = k+1; i < Len; i++ )
        if ( pStr[i] == '1' )
            Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), Len-i-1 );
        else if ( pStr[i] != '0' )
            printf( "Wrongn symbol (%c) in binary Verilog constant \"%s\".\n", pStr[i], pStr );
}